

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int decode_certificate_request
              (ptls_t *tls,st_ptls_certificate_request_t *cr,uint8_t *src,uint8_t *end)

{
  code *pcVar1;
  int iVar2;
  void *pvVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *in_RCX;
  byte *in_RDX;
  byte *p;
  undefined8 *in_RSI;
  uint8_t **in_RDI;
  ptls_iovec_t pVar6;
  uint8_t *end_3;
  uint8_t *_src_2;
  uint64_t _block_size64_2;
  size_t _block_size_2;
  size_t _capacity_2;
  uint8_t *end_2;
  uint8_t *_src_1;
  uint64_t _block_size64_1;
  size_t _block_size_1;
  size_t _capacity_1;
  st_ptls_extension_bitmap_t bitmap;
  size_t len;
  uint8_t *end_1;
  uint8_t *_src;
  uint64_t _block_size64;
  size_t _block_size;
  size_t _capacity;
  uint16_t exttype;
  int ret;
  uint8_t *in_stack_ffffffffffffff18;
  uint8_t **in_stack_ffffffffffffff20;
  undefined6 in_stack_ffffffffffffff28;
  uint16_t in_stack_ffffffffffffff2e;
  size_t local_c8;
  uint8_t *local_c0;
  size_t local_b8;
  uint8_t **in_stack_ffffffffffffff58;
  st_ptls_signature_algorithms_t *in_stack_ffffffffffffff60;
  ulong local_98;
  long local_90;
  undefined8 in_stack_ffffffffffffff88;
  uint8_t hstype;
  st_ptls_extension_bitmap_t *in_stack_ffffffffffffff90;
  ulong uVar7;
  long local_68;
  st_ptls_extension_bitmap_t local_60;
  size_t local_58;
  byte *local_50;
  ulong local_38;
  long local_30;
  uint16_t local_26;
  uint local_24;
  byte *local_20;
  byte *local_18;
  undefined8 *local_10;
  uint8_t **local_8;
  
  hstype = (uint8_t)((ulong)in_stack_ffffffffffffff88 >> 0x38);
  local_30 = 1;
  if (in_RCX == in_RDX) {
    local_24 = 0x32;
  }
  else {
    local_38 = 0;
    local_18 = in_RDX;
    do {
      pbVar5 = local_18 + 1;
      local_38 = local_38 << 8 | (ulong)*local_18;
      local_30 = local_30 + -1;
      local_18 = pbVar5;
    } while (local_30 != 0);
    local_26 = 0;
    if ((ulong)((long)in_RCX - (long)pbVar5) < local_38) {
      local_24 = 0x32;
    }
    else {
      local_50 = pbVar5 + local_38;
      local_58 = (long)local_50 - (long)pbVar5;
      if (local_58 < 0x100) {
        local_c8 = local_58;
        if (local_58 == 0) {
          local_c8 = 1;
        }
        local_20 = in_RCX;
        local_10 = in_RSI;
        local_8 = in_RDI;
        pvVar3 = malloc(local_c8);
        *local_10 = pvVar3;
        if (pvVar3 == (void *)0x0) {
          local_24 = 0x201;
        }
        else {
          local_10[1] = local_58;
          memcpy((void *)*local_10,local_18,local_58);
          local_18 = local_50;
          init_extension_bitmap(in_stack_ffffffffffffff90,hstype);
          local_68 = 2;
          if ((ulong)((long)local_20 - (long)local_18) < 2) {
            local_24 = 0x32;
          }
          else {
            uVar7 = 0;
            do {
              pbVar5 = local_18 + 1;
              uVar7 = uVar7 << 8 | (ulong)*local_18;
              local_68 = local_68 + -1;
              local_18 = pbVar5;
            } while (local_68 != 0);
            if ((ulong)((long)local_20 - (long)pbVar5) < uVar7) {
              local_24 = 0x32;
            }
            else {
              pbVar4 = pbVar5 + uVar7;
              while (local_18 = pbVar5, local_18 != pbVar4) {
                local_24 = ptls_decode16((uint16_t *)
                                         CONCAT26(in_stack_ffffffffffffff2e,
                                                  in_stack_ffffffffffffff28),
                                         in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
                if (local_24 != 0) {
                  return local_24;
                }
                iVar2 = extension_bitmap_is_set(&local_60,local_26);
                if (iVar2 != 0) {
                  return 0x2f;
                }
                extension_bitmap_set(&local_60,local_26);
                local_90 = 2;
                if ((ulong)((long)pbVar4 - (long)local_18) < 2) {
                  return 0x32;
                }
                local_98 = 0;
                do {
                  p = local_18 + 1;
                  local_98 = local_98 << 8 | (ulong)*local_18;
                  local_90 = local_90 + -1;
                  local_18 = p;
                } while (local_90 != 0);
                if ((ulong)((long)pbVar4 - (long)p) < local_98) {
                  return 0x32;
                }
                pbVar5 = p + local_98;
                if (*(long *)(*local_8 + 0xb0) != 0) {
                  pcVar1 = (code *)**(undefined8 **)(*local_8 + 0xb0);
                  in_stack_ffffffffffffff18 = *(uint8_t **)(*local_8 + 0xb0);
                  in_stack_ffffffffffffff20 = local_8;
                  in_stack_ffffffffffffff2e = local_26;
                  pVar6 = ptls_iovec_init(p,(long)pbVar5 - (long)p);
                  local_c0 = pVar6.base;
                  local_b8 = pVar6.len;
                  iVar2 = (*pcVar1)(in_stack_ffffffffffffff18,in_stack_ffffffffffffff20,0xd,
                                    in_stack_ffffffffffffff2e,local_c0,local_b8);
                  local_24 = (uint)(iVar2 != 0);
                  if (iVar2 != 0) {
                    return local_24;
                  }
                }
                if (local_26 == 0xd) {
                  iVar2 = decode_signature_algorithms
                                    (in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,pbVar5);
                  if (iVar2 != 0) {
                    return iVar2;
                  }
                  local_24 = 0;
                }
              }
              if (local_18 == pbVar4) {
                if (local_18 == local_20) {
                  if (local_10[6] == 0) {
                    local_24 = 0x6d;
                  }
                  else {
                    local_24 = 0;
                  }
                }
                else {
                  local_24 = 0x32;
                }
              }
              else {
                local_24 = 0x32;
              }
            }
          }
        }
      }
      else {
        local_24 = 0x32;
      }
    }
  }
  return local_24;
}

Assistant:

static int decode_certificate_request(ptls_t *tls, struct st_ptls_certificate_request_t *cr, const uint8_t *src,
                                      const uint8_t *const end)
{
    int ret;
    uint16_t exttype = 0;

    /* certificate request context */
    ptls_decode_open_block(src, end, 1, {
        size_t len = end - src;
        if (len > 255) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        if ((cr->context.base = malloc(len != 0 ? len : 1)) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        cr->context.len = len;
        memcpy(cr->context.base, src, len);
        src = end;
    });

    /* decode extensions */
    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_CERTIFICATE_REQUEST, &exttype, {
        if (tls->ctx->on_extension != NULL &&
            (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_CERTIFICATE_REQUEST, exttype,
                                              ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS:
            if ((ret = decode_signature_algorithms(&cr->signature_algorithms, &src, end)) != 0)
                goto Exit;
            break;
        }
        src = end;
    });

    if (cr->signature_algorithms.count == 0) {
        ret = PTLS_ALERT_MISSING_EXTENSION;
        goto Exit;
    }

    ret = 0;
Exit:
    return ret;
}